

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O2

void rlPushMatrix(void)

{
  Matrix *pMVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  long lVar17;
  
  if (0x1f < RLGL.State.stackCounter) {
    TraceLog(5,"RLGL: Matrix stack overflow (MAX_MATRIX_STACK_SIZE)");
  }
  if (RLGL.State.currentMatrixMode == 0x1700) {
    RLGL.State.transformRequired = true;
    RLGL.State.currentMatrix = &RLGL.State.transform;
  }
  lVar17 = (long)RLGL.State.stackCounter;
  fVar13 = (RLGL.State.currentMatrix)->m0;
  fVar14 = (RLGL.State.currentMatrix)->m4;
  fVar15 = (RLGL.State.currentMatrix)->m8;
  fVar16 = (RLGL.State.currentMatrix)->m12;
  fVar9 = (RLGL.State.currentMatrix)->m1;
  fVar10 = (RLGL.State.currentMatrix)->m5;
  fVar11 = (RLGL.State.currentMatrix)->m9;
  fVar12 = (RLGL.State.currentMatrix)->m13;
  fVar5 = (RLGL.State.currentMatrix)->m2;
  fVar6 = (RLGL.State.currentMatrix)->m6;
  fVar7 = (RLGL.State.currentMatrix)->m10;
  fVar8 = (RLGL.State.currentMatrix)->m14;
  fVar2 = (RLGL.State.currentMatrix)->m7;
  fVar3 = (RLGL.State.currentMatrix)->m11;
  fVar4 = (RLGL.State.currentMatrix)->m15;
  pMVar1 = RLGL.State.stack + lVar17;
  pMVar1->m3 = (RLGL.State.currentMatrix)->m3;
  pMVar1->m7 = fVar2;
  pMVar1 = RLGL.State.stack + lVar17;
  pMVar1->m11 = fVar3;
  pMVar1->m15 = fVar4;
  pMVar1 = RLGL.State.stack + lVar17;
  pMVar1->m2 = fVar5;
  pMVar1->m6 = fVar6;
  pMVar1 = RLGL.State.stack + lVar17;
  pMVar1->m10 = fVar7;
  pMVar1->m14 = fVar8;
  pMVar1 = RLGL.State.stack + lVar17;
  pMVar1->m1 = fVar9;
  pMVar1->m5 = fVar10;
  pMVar1 = RLGL.State.stack + lVar17;
  pMVar1->m9 = fVar11;
  pMVar1->m13 = fVar12;
  pMVar1 = RLGL.State.stack + lVar17;
  pMVar1->m0 = fVar13;
  pMVar1->m4 = fVar14;
  pMVar1 = RLGL.State.stack + lVar17;
  pMVar1->m8 = fVar15;
  pMVar1->m12 = fVar16;
  RLGL.State.stackCounter = RLGL.State.stackCounter + 1;
  return;
}

Assistant:

void rlPushMatrix(void)
{
    if (RLGL.State.stackCounter >= MAX_MATRIX_STACK_SIZE) TRACELOG(LOG_ERROR, "RLGL: Matrix stack overflow (MAX_MATRIX_STACK_SIZE)");

    if (RLGL.State.currentMatrixMode == RL_MODELVIEW)
    {
        RLGL.State.transformRequired = true;
        RLGL.State.currentMatrix = &RLGL.State.transform;
    }

    RLGL.State.stack[RLGL.State.stackCounter] = *RLGL.State.currentMatrix;
    RLGL.State.stackCounter++;
}